

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hash.h
# Opt level: O0

void slang::hash_combine<unsigned_long,unsigned_int>(size_t *seed,unsigned_long *v,uint rest)

{
  uint64_t uVar1;
  undefined4 in_EDX;
  hash<unsigned_long,_void> *in_RSI;
  ulong *in_RDI;
  hash<unsigned_long,_void> hasher;
  undefined4 in_stack_ffffffffffffffe8;
  
  uVar1 = hash<unsigned_long,_void>::operator()
                    (in_RSI,(unsigned_long *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  *in_RDI = uVar1 + 0x9e3779b9 + *in_RDI * 0x40 + (*in_RDI >> 2) ^ *in_RDI;
  hash_combine<unsigned_int>((size_t *)in_RSI,(uint *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  return;
}

Assistant:

inline void hash_combine(size_t& seed, const T& v, Rest... rest) {
    hash<T> hasher;
    seed ^= hasher(v) + 0x9e3779b9 + (seed << 6) + (seed >> 2);
    hash_combine(seed, rest...);
}